

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexCache.cpp
# Opt level: O2

void __thiscall Ptex::v2_2::PtexReaderCache::purge(PtexReaderCache *this,PtexTexture *texture)

{
  LOCK();
  *(int *)&texture[0x5a]._vptr_PtexTexture = *(int *)&texture[0x5a]._vptr_PtexTexture + -1;
  UNLOCK();
  purge(this,(PtexCachedReader *)texture);
  PtexCachedReader::ref((PtexCachedReader *)texture);
  return;
}

Assistant:

void PtexReaderCache::purge(PtexTexture* texture)
{
    PtexCachedReader* reader = static_cast<PtexCachedReader*>(texture);
    reader->unref();
    purge(reader);
    reader->ref();
}